

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  BamReaderPrivate *this_00;
  pointer pBVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  int64_t iVar5;
  ostream *poVar6;
  long *plVar7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  int iVar9;
  int iVar10;
  uint32_t currentBin;
  uint64_t lastOffset;
  uint64_t currentOffset;
  BaiReferenceEntry refEntry;
  string readerError;
  string indexFilename;
  string message;
  uint32_t local_3f4;
  uint64_t local_3f0;
  int local_3e8;
  uint local_3e4;
  uint64_t local_3e0;
  uint64_t local_3d8;
  uint64_t local_3d0;
  undefined1 local_3c8 [8];
  undefined1 local_3c0 [8];
  _Rb_tree_node_base local_3b8;
  size_t local_398;
  BaiLinearOffsetVector BStack_390;
  string local_378;
  undefined1 local_358 [8];
  undefined1 auStack_350 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Base_ptr local_338;
  _Base_ptr local_330;
  size_t local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_320;
  undefined8 uStack_310;
  ios_base local_2d8 [272];
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  char local_178 [152];
  int local_e0;
  int local_dc;
  ushort local_d8;
  
  this_00 = (this->super_BamIndex).m_reader;
  if ((this_00 == (BamReaderPrivate *)0x0) || (bVar2 = BamReaderPrivate::IsOpen(this_00), !bVar2)) {
    local_358 = (undefined1  [8])(auStack_350 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"BamStandardIndex::Create","");
    local_188._M_allocated_capacity = (size_type)local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"could not create index: reader is not open","");
    BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_358,(string *)&local_188);
    if ((char *)local_188._M_allocated_capacity != local_178) {
      operator_delete((void *)local_188._M_allocated_capacity);
    }
    if (local_358 == (undefined1  [8])(auStack_350 + 8)) {
      return false;
    }
  }
  else {
    bVar2 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
    if (bVar2) {
      BamReaderPrivate::Filename_abi_cxx11_((string *)local_358,(this->super_BamIndex).m_reader);
      local_188._M_allocated_capacity = (size_type)local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p,
                 BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p +
                 BAI_EXTENSION_abi_cxx11_._M_string_length);
      std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188
                    );
      if ((char *)local_188._M_allocated_capacity != local_178) {
        operator_delete((void *)local_188._M_allocated_capacity);
      }
      if (local_358 != (undefined1  [8])(auStack_350 + 8)) {
        operator_delete((void *)local_358);
      }
      OpenFile(this,&local_1a8,ReadWrite);
      local_3e8 = BamReaderPrivate::GetReferenceCount((this->super_BamIndex).m_reader);
      pBVar1 = (this->m_indexFileSummary).
               super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_indexFileSummary).
          super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
          ._M_impl.super__Vector_impl_data._M_finish != pBVar1) {
        (this->m_indexFileSummary).
        super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
        ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
      }
      local_358 = (undefined1  [8])0x0;
      auStack_350 = (undefined1  [8])0x0;
      local_348._M_allocated_capacity = 0;
      std::
      vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
      ::_M_fill_assign(&this->m_indexFileSummary,(long)local_3e8,(value_type *)local_358);
      WriteHeader(this);
      local_3f4 = 0xffffffff;
      uVar4 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
      local_3e0 = uVar4;
      local_3d8 = uVar4;
      BamAlignment::BamAlignment((BamAlignment *)&local_188);
      local_3b8._M_left = &local_3b8;
      local_3c8._0_4_ = -1;
      local_3b8._M_color = _S_red;
      local_3b8._M_parent = (_Base_ptr)0x0;
      local_398 = 0;
      BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3e4 = 0xffffffff;
      uVar8 = 0xffffffff;
      iVar9 = -1;
      iVar10 = -1;
      iVar3 = -1;
      local_3f0 = uVar4;
      local_3d0 = uVar4;
      local_3b8._M_right = local_3b8._M_left;
      while( true ) {
        this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(this->super_BamIndex).m_reader;
        bVar2 = BamReaderPrivate::LoadNextAlignment
                          ((BamReaderPrivate *)this_01,(BamAlignment *)&local_188);
        if (!bVar2) break;
        if (iVar10 == local_e0) {
          if (iVar3 <= local_dc) goto LAB_00198489;
          std::__cxx11::stringstream::stringstream((stringstream *)local_358);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(auStack_350 + 8),"BAM file is not properly sorted by coordinate",
                     0x2d);
          std::ios::widen((char)*(undefined8 *)(local_348._M_allocated_capacity - 0x18) +
                          (char)auStack_350 + '\b');
          std::ostream::put((char)auStack_350 + '\b');
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"Current alignment position: ",0x1c);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_dc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," < previous alignment position: ",0x20);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," on reference ID: ",0x12);
          plVar7 = (long *)std::ostream::operator<<(poVar6,local_e0);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,"BamStandardIndex::Create","");
          std::__cxx11::stringbuf::str();
          BamIndex::SetErrorString(&this->super_BamIndex,&local_378,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
          std::ios_base::~ios_base(local_2d8);
LAB_00198900:
          bVar2 = false;
          goto LAB_00198a0b;
        }
        if (iVar10 == -1) {
          if (0 < local_e0) {
            iVar10 = 0;
            do {
              local_358._0_4_ = iVar10;
              local_348._M_allocated_capacity = local_348._M_allocated_capacity & 0xffffffff00000000
              ;
              local_348._8_8_ = 0;
              local_338 = (_Base_ptr)(auStack_350 + 8);
              aStack_320._8_8_ = 0;
              uStack_310 = 0;
              local_328 = 0;
              aStack_320._M_allocated_capacity = 0;
              local_330 = local_338;
              WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
              WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
              if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
                operator_delete((void *)aStack_320._M_allocated_capacity);
              }
              this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)auStack_350;
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                           *)this_01);
              iVar10 = iVar10 + 1;
            } while (iVar10 < local_e0);
          }
        }
        else {
          SaveAlignmentChunkToBin
                    ((BamStandardIndex *)this_01,(BaiBinMap *)local_3c0,&local_3f4,&local_3d8,
                     &local_3e0);
          WriteBins(this,(int *)local_3c8,(BaiBinMap *)local_3c0);
          WriteLinearOffsets(this,(int *)local_3c8,&BStack_390);
          local_3c8._0_4_ = -1;
          this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0;
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                   *)this_01);
          if (BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          iVar10 = iVar10 + 1;
          if (iVar10 < local_e0) {
            do {
              local_358._0_4_ = iVar10;
              local_348._M_allocated_capacity = local_348._M_allocated_capacity & 0xffffffff00000000
              ;
              local_348._8_8_ = 0;
              local_338 = (_Base_ptr)(auStack_350 + 8);
              aStack_320._8_8_ = 0;
              uStack_310 = 0;
              local_328 = 0;
              aStack_320._M_allocated_capacity = 0;
              local_330 = local_338;
              WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
              WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
              if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
                operator_delete((void *)aStack_320._M_allocated_capacity);
              }
              this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)auStack_350;
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                           *)auStack_350);
              iVar10 = iVar10 + 1;
            } while (iVar10 < local_e0);
          }
          local_3d8 = local_3f0;
          local_3f4 = (uint32_t)local_d8;
          local_3d0 = local_3f0;
          local_3e4 = local_3f4;
          iVar9 = local_e0;
        }
        uVar8 = 0xffffffff;
        iVar10 = local_e0;
        local_3c8._0_4_ = local_e0;
LAB_00198489:
        if (local_d8 < 0x1249 && -1 < iVar10) {
          this_01 = &local_188;
          iVar3 = BamAlignment::GetEndPosition((BamAlignment *)this_01,false,false);
          local_358._0_4_ = iVar3;
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)this_01,&BStack_390,&local_dc,(int *)local_358,&local_3e0);
        }
        if (uVar8 != local_d8) {
          if (local_3e4 != 0xffffffff) {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)this_01,(BaiBinMap *)local_3c0,&local_3f4,&local_3d8,
                       &local_3e0);
          }
          uVar8 = (uint)local_d8;
          local_3d8 = local_3f0;
          local_3d0 = local_3f0;
          iVar9 = local_e0;
          local_3f4 = uVar8;
          local_3e4 = uVar8;
          if (local_e0 < 0) break;
        }
        iVar5 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        if (iVar5 <= (long)local_3f0) {
          local_358 = (undefined1  [8])(auStack_350 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_358,"BamStandardIndex::Create","");
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,"calculating offsets failed","");
          BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_358,&local_378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          if (local_358 != (undefined1  [8])(auStack_350 + 8)) {
            operator_delete((void *)local_358);
          }
          goto LAB_00198900;
        }
        local_3f0 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        iVar3 = local_dc;
        local_3e0 = local_3f0;
      }
      if (local_3f0 != local_3d0) {
        SaveAlignmentChunkToBin
                  ((BamStandardIndex *)this_01,(BaiBinMap *)local_3c0,&local_3f4,&local_3d8,
                   &local_3e0);
        WriteBins(this,(int *)local_3c8,(BaiBinMap *)local_3c0);
        WriteLinearOffsets(this,(int *)local_3c8,&BStack_390);
      }
      iVar9 = iVar9 + 1;
      bVar2 = true;
      if (iVar9 < local_3e8) {
        do {
          local_358._0_4_ = iVar9;
          local_348._M_allocated_capacity = local_348._M_allocated_capacity & 0xffffffff00000000;
          local_348._8_8_ = 0;
          local_338 = (_Base_ptr)(auStack_350 + 8);
          aStack_320._8_8_ = 0;
          uStack_310 = 0;
          local_328 = 0;
          aStack_320._M_allocated_capacity = 0;
          local_330 = local_338;
          WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
          WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
          if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
            operator_delete((void *)aStack_320._M_allocated_capacity);
          }
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                       *)auStack_350);
          iVar9 = iVar9 + 1;
        } while (local_3e8 != iVar9);
        bVar2 = true;
      }
LAB_00198a0b:
      if (BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_390.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                   *)local_3c0);
      BamAlignment::~BamAlignment((BamAlignment *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if (!bVar2) {
        return false;
      }
      bVar2 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
      if (bVar2) {
        return true;
      }
      BamReaderPrivate::GetErrorString_abi_cxx11_
                ((string *)local_358,(this->super_BamIndex).m_reader);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188
                     ,"could not create index: \n\t",(string *)local_358);
      local_3c8 = (undefined1  [8])&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"BamStandardIndex::Create","");
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_3c8,(string *)&local_188);
      if (local_3c8 != (undefined1  [8])&local_3b8) {
        operator_delete((void *)local_3c8);
      }
      if ((char *)local_188._M_allocated_capacity != local_178) {
        operator_delete((void *)local_188._M_allocated_capacity);
      }
    }
    else {
      BamReaderPrivate::GetErrorString_abi_cxx11_
                ((string *)local_358,(this->super_BamIndex).m_reader);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188
                     ,"could not create index: \n\t",(string *)local_358);
      local_3c8 = (undefined1  [8])&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"BamStandardIndex::Create","");
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_3c8,(string *)&local_188);
      if (local_3c8 != (undefined1  [8])&local_3b8) {
        operator_delete((void *)local_3c8);
      }
      if ((char *)local_188._M_allocated_capacity != local_178) {
        operator_delete((void *)local_188._M_allocated_capacity);
      }
    }
    if (local_358 == (undefined1  [8])(auStack_350 + 8)) {
      return false;
    }
  }
  operator_delete((void *)local_358);
  return false;
}

Assistant:

bool BamStandardIndex::Create()
{

    // skip if BamReader is invalid or not open
    if (m_reader == 0 || !m_reader->IsOpen()) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if (!m_reader->Rewind()) {
        const std::string readerError = m_reader->GetErrorString();
        const std::string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        std::string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin = defaultValue;
        uint32_t lastBin = defaultValue;
        int32_t currentRefID = defaultValue;
        int32_t lastRefID = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset = currentOffset;
        int32_t lastPosition = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while (m_reader->LoadNextAlignment(al)) {

            // changed to new reference
            if (lastRefID != al.RefID) {

                // if not first reference, save previous reference data
                if (lastRefID != (int32_t)defaultValue) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for (int i = lastRefID + 1; i < al.RefID; ++i) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin = al.Bin;
                    lastBin = al.Bin;
                    currentRefID = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for (int i = 0; i < al.RefID; ++i) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID = al.RefID;
                lastBin = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if (lastPosition > al.Position) {
                std::stringstream s;
                s << "BAM file is not properly sorted by coordinate" << std::endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << std::endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ((al.RefID >= 0) && (al.Bin < 4681))
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(),
                                      lastOffset);

            // changed to new BAI bin
            if (al.Bin != lastBin) {

                // if not first bin on reference, save previous bin data
                if (currentBin != defaultValue)
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin = al.Bin;
                lastBin = al.Bin;
                currentRefID = al.RefID;

                // if invalid RefID, break out
                if (currentRefID < 0) break;
            }

            // make sure that current file pointer is beyond lastOffset
            if (m_reader->Tell() <= (int64_t)lastOffset) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if (lastOffset != currentOffset) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for (int i = currentRefID + 1; i < numReferences; ++i) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if (!m_reader->Rewind()) {
        const std::string readerError = m_reader->GetErrorString();
        const std::string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}